

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O2

int streamResizeBuffer(roslz4_stream *str,int block_size_id)

{
  void *pvVar1;
  void *pvVar2;
  uint uVar3;
  
  if ((block_size_id & 0xfffffffcU) == 4) {
    pvVar1 = str->state;
    str->block_size_id = block_size_id;
    *(undefined4 *)((long)pvVar1 + 0x1c) = 0;
    uVar3 = 0x100 << ((char)block_size_id * '\x02' & 0x1fU);
    *(uint *)((long)pvVar1 + 0x18) = uVar3;
    pvVar2 = malloc((ulong)uVar3);
    *(void **)((long)pvVar1 + 0x10) = pvVar2;
    return (uint)(pvVar2 != (void *)0x0) * 5 + -5;
  }
  return -4;
}

Assistant:

int streamResizeBuffer(roslz4_stream *str, int block_size_id) {
  stream_state *state = str->state;
  if (!(4 <= block_size_id && block_size_id <= 7)) {
    return ROSLZ4_PARAM_ERROR; // Invalid block size
  }

  str->block_size_id = block_size_id;
  state->buffer_offset = 0;
  state->buffer_size = roslz4_blockSizeFromIndex(str->block_size_id);
  state->buffer = (char*) malloc(sizeof(char) * state->buffer_size);
  if (state->buffer == NULL) {
    return ROSLZ4_MEMORY_ERROR; // Allocation of buffer failed
  }
  return ROSLZ4_OK;
}